

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.cpp
# Opt level: O3

int __thiscall CompoundExp::eval(CompoundExp *this,EvalState *state)

{
  string *psVar1;
  _func_int **pp_Var2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  _Alloc_hider _Var7;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  psVar1 = &this->op;
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  pp_Var2 = this->lhs->_vptr_Expression;
  if (iVar4 == 0) {
    iVar4 = (*pp_Var2[4])();
    if (iVar4 != 1) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"SYNTAX ERROR","");
      error(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    iVar4 = (*this->rhs->_vptr_Expression[2])(this->rhs,state);
    (*this->lhs->_vptr_Expression[3])(&local_50);
    bVar3 = check_reserve(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (bVar3) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"SYNTAX ERROR","");
      error(&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
    pp_Var2 = this->lhs[1]._vptr_Expression;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pp_Var2,(long)this->lhs[2]._vptr_Expression + (long)pp_Var2);
    EvalState::setValue(state,&local_b0,iVar4);
    _Var7._M_p = local_b0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
      return iVar4;
    }
  }
  else {
    iVar4 = (*pp_Var2[2])(this->lhs,state);
    iVar5 = (*this->rhs->_vptr_Expression[2])(this->rhs,state);
    iVar6 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar6 == 0) {
      return iVar5 + iVar4;
    }
    iVar6 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar6 == 0) {
      return iVar4 - iVar5;
    }
    iVar6 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar6 == 0) {
      return iVar5 * iVar4;
    }
    iVar6 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar6 == 0) {
      if (iVar5 == 0) {
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"DIVIDE BY ZERO","");
        error(&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
      }
      return iVar4 / iVar5;
    }
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"SYNTAX ERROR","");
    error(&local_f0);
    iVar4 = 0;
    local_b0.field_2._M_allocated_capacity = local_f0.field_2._M_allocated_capacity;
    _Var7._M_p = local_f0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p == &local_f0.field_2) {
      return 0;
    }
  }
  operator_delete(_Var7._M_p,local_b0.field_2._M_allocated_capacity + 1);
  return iVar4;
}

Assistant:

int CompoundExp::eval(EvalState & state) {
   if (op == "=") {
      if (lhs->getType() != IDENTIFIER) {
         error("SYNTAX ERROR");
      }
      int val = rhs->eval(state);
      if (check_reserve(lhs->toString())) error("SYNTAX ERROR");
      state.setValue(((IdentifierExp *) lhs)->getName(), val);
      return val;
   }
   int left = lhs->eval(state);
   int right = rhs->eval(state);
   if (op == "+") return left + right;
   if (op == "-") return left - right;
   if (op == "*") return left * right;
   if (op == "/") {
       if (right==0) error("DIVIDE BY ZERO");
       return left / right;
   }
   error("SYNTAX ERROR");
   return 0;
}